

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

bool group_selective_undo_allowed_proc(Am_Object *command_obj)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object local_50;
  Am_Value local_48 [2];
  undefined1 local_28 [8];
  Am_Value value;
  Am_Object new_group;
  Am_Object *command_obj_local;
  
  Am_Object::Am_Object((Am_Object *)&value.value);
  Am_Value::Am_Value((Am_Value *)local_28);
  pAVar2 = Am_Object::Get(command_obj,0x169,0);
  Am_Object::operator=((Am_Object *)&value.value,pAVar2);
  pAVar2 = Am_Object::Peek(command_obj,0x16d,0);
  Am_Value::operator=((Am_Value *)local_28,pAVar2);
  Am_Value::Am_Value(local_48,(Am_Value *)local_28);
  Am_Object::Am_Object(&local_50,(Am_Object *)&value.value);
  bVar1 = check_all_vis_and_in_group(local_48,&local_50,false);
  Am_Object::~Am_Object(&local_50);
  Am_Value::~Am_Value(local_48);
  Am_Value::~Am_Value((Am_Value *)local_28);
  Am_Object::~Am_Object((Am_Object *)&value.value);
  return bVar1;
}

Assistant:

Am_Define_Method(Am_Selective_Allowed_Method, bool,
                 group_selective_undo_allowed, (Am_Object command_obj))
{
  Am_Object new_group;
  Am_Value value;
  new_group = command_obj.Get(Am_VALUE);
  value = command_obj.Peek(Am_OBJECT_MODIFIED);
  return check_all_vis_and_in_group(value, new_group, false);
}